

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall
Json::Path::addPathInArg(Path *this,string *param_2,InArgs *in,const_iterator *itInArg,Kind kind)

{
  bool bVar1;
  const_iterator this_00;
  reference ppPVar2;
  value_type *in_RCX;
  __normal_iterator<const_Json::PathArgument_*const_*,_std::vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>_>
  *in_RDI;
  Kind in_R8D;
  vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
  *in_stack_ffffffffffffffb8;
  value_type *__x;
  
  __x = in_RCX;
  this_00 = std::vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>::
            end(in_stack_ffffffffffffffb8);
  bVar1 = __gnu_cxx::operator==
                    (in_RDI,(__normal_iterator<const_Json::PathArgument_*const_*,_std::vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>_>
                             *)in_stack_ffffffffffffffb8);
  if ((!bVar1) &&
     (ppPVar2 = __gnu_cxx::
                __normal_iterator<const_Json::PathArgument_*const_*,_std::vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>_>
                ::operator*((__normal_iterator<const_Json::PathArgument_*const_*,_std::vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>_>
                             *)in_RCX), (*ppPVar2)->kind_ == in_R8D)) {
    __gnu_cxx::
    __normal_iterator<const_Json::PathArgument_*const_*,_std::vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>_>
    ::operator*((__normal_iterator<const_Json::PathArgument_*const_*,_std::vector<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>_>
                 *)in_RCX);
    std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::push_back
              ((vector<Json::PathArgument,_std::allocator<Json::PathArgument>_> *)this_00._M_current
               ,__x);
  }
  return;
}

Assistant:

void Path::addPathInArg(const std::string& /*path*/,
                        const InArgs& in,
                        InArgs::const_iterator& itInArg,
                        PathArgument::Kind kind) {
  if (itInArg == in.end()) {
    // Error: missing argument %d
  } else if ((*itInArg)->kind_ != kind) {
    // Error: bad argument type
  } else {
    args_.push_back(**itInArg);
  }
}